

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::Client::write_request(Client *this,Stream *strm,Request *req)

{
  bool bVar1;
  uint uVar2;
  int __fd;
  char *pcVar3;
  ulong uVar4;
  unsigned_long __val;
  void *__buf;
  undefined8 uVar5;
  undefined8 uVar6;
  char **args_1;
  string *data;
  string length;
  char *local_80 [3];
  undefined1 local_68 [8];
  string path;
  BufferStream bstrm;
  Request *req_local;
  Stream *strm_local;
  Client *this_local;
  
  BufferStream::BufferStream((BufferStream *)((long)&path.field_2 + 8));
  detail::encode_url((string *)local_68,&req->path);
  local_80[0] = (char *)std::__cxx11::string::c_str();
  length.field_2._8_8_ = std::__cxx11::string::c_str();
  args_1 = (char **)((long)&length.field_2 + 8);
  Stream::write_format<char_const*,char_const*>
            ((Stream *)((long)&path.field_2 + 8),"%s %s HTTP/1.1\r\n",local_80,args_1);
  uVar2 = (*this->_vptr_Client[4])();
  if ((uVar2 & 1) == 0) {
    if (this->port_ == 0x50) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      Request::set_header(req,"Host",pcVar3);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      Request::set_header(req,"Host",pcVar3);
    }
  }
  else if (this->port_ == 0x1bb) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    Request::set_header(req,"Host",pcVar3);
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    Request::set_header(req,"Host",pcVar3);
  }
  bVar1 = Request::has_header(req,"Accept");
  if (!bVar1) {
    Request::set_header(req,"Accept","*/*");
  }
  bVar1 = Request::has_header(req,"User-Agent");
  if (!bVar1) {
    Request::set_header(req,"User-Agent","cpp-httplib/0.2");
  }
  Request::set_header(req,"Connection","close");
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar1 = Request::has_header(req,"Content-Type");
    if (!bVar1) {
      Request::set_header(req,"Content-Type","text/plain");
    }
    __val = std::__cxx11::string::size();
    std::__cxx11::to_string((string *)&data,__val);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    Request::set_header(req,"Content-Length",pcVar3);
    std::__cxx11::string::~string((string *)&data);
  }
  else {
    bVar1 = std::operator==(&req->method,"POST");
    if ((bVar1) || (bVar1 = std::operator==(&req->method,"PUT"), bVar1)) {
      Request::set_header(req,"Content-Length","0");
    }
  }
  detail::write_headers<httplib::Request>((Stream *)((long)&path.field_2 + 8),req);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    __fd = std::__cxx11::string::c_str();
    __buf = (void *)std::__cxx11::string::size();
    BufferStream::write((BufferStream *)((long)&path.field_2 + 8),__fd,__buf,(size_t)args_1);
  }
  BufferStream::get_buffer_abi_cxx11_((BufferStream *)((long)&path.field_2 + 8));
  uVar5 = std::__cxx11::string::data();
  uVar6 = std::__cxx11::string::size();
  (*strm->_vptr_Stream[3])(strm,uVar5,uVar6);
  std::__cxx11::string::~string((string *)local_68);
  BufferStream::~BufferStream((BufferStream *)((long)&path.field_2 + 8));
  return;
}

Assistant:

inline void Client::write_request(Stream& strm, Request& req)
{
    BufferStream bstrm;

    // Request line
    auto path = detail::encode_url(req.path);

    bstrm.write_format("%s %s HTTP/1.1\r\n",
        req.method.c_str(),
        path.c_str());

    // Headers
    if (is_ssl()) {
        if (port_ == 443) {
            req.set_header("Host", host_.c_str());
        } else {
            req.set_header("Host", host_and_port_.c_str());
        }
    } else {
        if (port_ == 80) {
            req.set_header("Host", host_.c_str());
        } else {
            req.set_header("Host", host_and_port_.c_str());
        }
    }

    if (!req.has_header("Accept")) {
        req.set_header("Accept", "*/*");
    }

    if (!req.has_header("User-Agent")) {
        req.set_header("User-Agent", "cpp-httplib/0.2");
    }

    // TODO: Support KeepAlive connection
    // if (!req.has_header("Connection")) {
        req.set_header("Connection", "close");
    // }

    if (req.body.empty()) {
        if (req.method == "POST" || req.method == "PUT") {
            req.set_header("Content-Length", "0");
        }
    } else {
        if (!req.has_header("Content-Type")) {
            req.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(req.body.size());
        req.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(bstrm, req);

    // Body
    if (!req.body.empty()) {
        bstrm.write(req.body.c_str(), req.body.size());
    }

    // Flush buffer
    auto& data = bstrm.get_buffer();
    strm.write(data.data(), data.size());
}